

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O3

string * ChecksumNameShort_abi_cxx11_
                   (string *__return_storage_ptr__,
                   set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *methods)

{
  bool bVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var3 = (methods->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(methods->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    bVar1 = true;
    do {
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"|",1);
      }
      uVar2 = (ulong)p_Var3[1]._M_color;
      if (uVar2 < 7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,&DAT_001ade74 + *(int *)(&DAT_001ade74 + uVar2 * 4),
                   *(long *)(&DAT_001ade90 + uVar2 * 8));
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ChecksumNameShort(std::set<ChecksumType> methods)
{
    std::stringstream ss;
    bool first = true;

    for (auto& m : methods)
    {
        if (!first)
            ss << "|";
        first = false;

        switch (m)
        {
        case ChecksumType::None:            ss << "none"; break;
        case ChecksumType::Constant_8C15:   ss << "8C15"; break;
        case ChecksumType::Sum_1800:        ss << "sum"; break;
        case ChecksumType::XOR_1800:        ss << "xor"; break;
        case ChecksumType::XOR_18A0:        ss << "xorA0"; break;
        case ChecksumType::CRC_D2F6_1800:   ss << "crc0"; break;
        case ChecksumType::CRC_D2F6_1802:   ss << "crc2"; break;
        }
    }

    return ss.str();
}